

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

LaneArray<4> * __thiscall
wasm::getLanes<int,4>(LaneArray<4> *__return_storage_ptr__,wasm *this,Literal *val)

{
  Literal *other;
  byte *pbVar1;
  reference this_00;
  size_type __n;
  size_type sVar2;
  size_type __n_00;
  long lVar3;
  uint uVar4;
  undefined1 local_68 [8];
  array<unsigned_char,_16UL> bytes;
  
  if (*(long *)(this + 0x10) == 6) {
    _local_68 = Literal::getv128((Literal *)this);
    __return_storage_ptr__->_M_elems[0].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[0].type.id = 0;
    __return_storage_ptr__->_M_elems[1].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[1].type.id = 0;
    __return_storage_ptr__->_M_elems[2].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[2].type.id = 0;
    __return_storage_ptr__->_M_elems[3].field_0.i64 = 0;
    __return_storage_ptr__->_M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
    __return_storage_ptr__->_M_elems[3].type.id = 0;
    sVar2 = 0;
    for (__n_00 = 0; __n_00 != 4; __n_00 = __n_00 + 1) {
      uVar4 = 0;
      __n = sVar2;
      for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
        pbVar1 = std::array<unsigned_char,_16UL>::at((array<unsigned_char,_16UL> *)local_68,__n);
        uVar4 = uVar4 | (uint)*pbVar1 << ((byte)lVar3 & 0x1f);
        __n = __n + 1;
      }
      bytes._M_elems._8_4_ = uVar4;
      this_00 = std::array<wasm::Literal,_4UL>::at(__return_storage_ptr__,__n_00);
      other = (Literal *)(bytes._M_elems + 8);
      if (this_00 != other) {
        Literal::~Literal(this_00);
        Literal::Literal(this_00,other);
      }
      Literal::~Literal(other);
      sVar2 = sVar2 + 4;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,"LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = int, Lanes = 4]");
}

Assistant:

static LaneArray<Lanes> getLanes(const Literal& val) {
  assert(val.type == Type::v128);
  const size_t lane_width = 16 / Lanes;
  std::array<uint8_t, 16> bytes = val.getv128();
  LaneArray<Lanes> lanes;
  for (size_t lane_index = 0; lane_index < Lanes; ++lane_index) {
    LaneT lane(0);
    for (size_t offset = 0; offset < lane_width; ++offset) {
      lane |= LaneT(bytes.at(lane_index * lane_width + offset))
              << LaneT(8 * offset);
    }
    lanes.at(lane_index) = Literal(lane);
  }
  return lanes;
}